

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_a4b191::TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration
          (TGlslangToSpvTraverser *this,Id id,Decoration decor)

{
  pointer pDVar1;
  pointer pDVar2;
  mapped_type *pmVar3;
  pointer pDVar4;
  Id local_c;
  
  local_c = id;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->idToQCOMDecorations,&local_c);
  pDVar1 = (pmVar3->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pDVar2 = (pmVar3->super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pDVar4 = pDVar2;
    if (pDVar4 == pDVar1) break;
    pDVar2 = pDVar4 + 1;
  } while (*pDVar4 != decor);
  return pDVar4 != pDVar1;
}

Assistant:

bool TGlslangToSpvTraverser::hasQCOMImageProceessingDecoration(spv::Id id, spv::Decoration decor)
{
  std::vector<spv::Decoration> &decoVec = idToQCOMDecorations[id];
  for ( auto d : decoVec ) {
    if ( d == decor )
      return true;
  }
  return false;
}